

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_jumpRelativeIfTrue
               (sysbvm_bytecodeJit_t *jit,int16_t conditionOperand,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  sysbvm_bytecodeJitPCRelocation_t relocation;
  size_t relocationOffset;
  size_t sStack_20;
  uint8_t instruction [6];
  size_t targetPC_local;
  int16_t conditionOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  sStack_20 = targetPC;
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,conditionOperand);
  sysbvm_jit_x86_cmpRAXWithImmediate32(jit,0x1f);
  relocationOffset._2_4_ = 0x840f;
  relocationOffset._6_2_ = 0;
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,6,(uint8_t *)((long)&relocationOffset + 2));
  relocation_00.targetPC = sStack_20;
  relocation_00.offset = sVar1 - 4;
  relocation_00.addend = -4;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelativeIfTrue(sysbvm_bytecodeJit_t *jit, int16_t conditionOperand, size_t targetPC)
{
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_RAX, conditionOperand);
    sysbvm_jit_x86_cmpRAXWithImmediate32(jit, SYSBVM_TRUE_TUPLE);

    uint8_t instruction[] = {
        // Jeq
        0x0F, 0x84, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}